

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

target_ulong helper_udiv_sparc64(CPUSPARCState_conflict1 *env,target_ulong a,target_ulong b)

{
  target_ulong tVar1;
  uintptr_t unaff_retaddr;
  target_ulong b_local;
  target_ulong a_local;
  CPUSPARCState_conflict1 *env_local;
  
  tVar1 = do_udiv(env,a,b,0,unaff_retaddr);
  return tVar1;
}

Assistant:

target_ulong helper_udiv(CPUSPARCState *env, target_ulong a, target_ulong b)
{
    return do_udiv(env, a, b, 0, GETPC());
}